

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::
SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_false>
::grow(SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_false>
       *this,size_t MinSize)

{
  undefined8 *__ptr;
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 *puVar6;
  
  __ptr = (undefined8 *)
          (this->
          super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_void>
          ).super_SmallVectorBase.BeginX;
  uVar5 = ((long)(this->
                 super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_void>
                 ).super_SmallVectorBase.CapacityX - (long)__ptr >> 3) * -0x5555555555555555 + 2;
  uVar5 = uVar5 >> 1 | uVar5;
  uVar5 = uVar5 >> 2 | uVar5;
  uVar5 = uVar5 >> 4 | uVar5;
  uVar5 = uVar5 >> 8 | uVar5;
  uVar5 = uVar5 >> 0x10 | uVar5;
  uVar5 = (uVar5 >> 0x20 | uVar5) + 1;
  if (uVar5 <= MinSize) {
    uVar5 = MinSize;
  }
  puVar1 = (undefined8 *)
           (this->
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_void>
           ).super_SmallVectorBase.EndX;
  puVar3 = (undefined8 *)malloc(uVar5 * 0x18);
  puVar4 = puVar3;
  for (puVar6 = __ptr; puVar6 != puVar1; puVar6 = puVar6 + 3) {
    puVar4[2] = puVar6[2];
    uVar2 = puVar6[1];
    *puVar4 = *puVar6;
    puVar4[1] = uVar2;
    puVar4 = puVar4 + 3;
  }
  if ((U *)__ptr !=
      &(this->
       super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_void>
       ).FirstEl) {
    free(__ptr);
  }
  (this->
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_void>
  ).super_SmallVectorBase.EndX = (void *)(((long)puVar1 - (long)__ptr) + (long)puVar3);
  (this->
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_void>
  ).super_SmallVectorBase.BeginX = puVar3;
  (this->
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_void>
  ).super_SmallVectorBase.CapacityX = puVar3 + uVar5 * 3;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  size_t CurCapacity = this->capacity();
  size_t CurSize = this->size();
  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(CurCapacity+2));
  if (NewCapacity < MinSize)
    NewCapacity = MinSize;
  T *NewElts = static_cast<T*>(malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->setEnd(NewElts+CurSize);
  this->BeginX = NewElts;
  this->CapacityX = this->begin()+NewCapacity;
}